

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

bool __thiscall capnp::DynamicStruct::Reader::isSetInUnion(Reader *this,Field field)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  Reader RStack_48;
  
  bVar3 = true;
  if ((0x1f < field.proto._reader.dataSize) && (*(short *)((long)field.proto._reader.data + 2) != 0)
     ) {
    Schema::getProto(&RStack_48,(Schema *)this);
    uVar2 = 0;
    if (0x11f < RStack_48._reader.dataSize) {
      uVar2 = *(uint *)((long)RStack_48._reader.data + 0x20);
    }
    if ((ulong)(this->reader).dataSize < (ulong)(uVar2 + 1) << 4) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)((long)(this->reader).data + (ulong)uVar2 * 2);
    }
    bVar3 = (uVar1 ^ *(ushort *)((long)field.proto._reader.data + 2)) == 0xffff;
  }
  return bVar3;
}

Assistant:

bool DynamicStruct::Reader::isSetInUnion(StructSchema::Field field) const {
  auto proto = field.getProto();
  if (hasDiscriminantValue(proto)) {
    uint16_t discrim = reader.getDataField<uint16_t>(
        assumeDataOffset(schema.getProto().getStruct().getDiscriminantOffset()));
    return discrim == proto.getDiscriminantValue();
  } else {
    return true;
  }
}